

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void disableTerm(WhereLevel *pLevel,WhereTerm *pTerm)

{
  u8 *puVar1;
  ushort uVar2;
  int iVar3;
  WhereTerm *pWVar4;
  int iVar5;
  long lVar6;
  u16 *puVar7;
  ushort uVar8;
  bool bVar9;
  
  uVar2 = pTerm->wtFlags;
  if ((uVar2 & 4) == 0) {
    puVar7 = &pTerm->wtFlags;
    iVar3 = pLevel->iLeftJoin;
    iVar5 = 0;
    do {
      if ((iVar3 != 0) && ((pTerm->pExpr->flags & 1) == 0)) {
        return;
      }
      if ((pLevel->notReady & pTerm->prereqAll) != 0) {
        return;
      }
      uVar8 = 0x200;
      if ((uVar2 >> 10 & 1) == 0) {
        uVar8 = 4;
      }
      bVar9 = iVar5 == 0;
      iVar5 = iVar5 + -1;
      if (bVar9) {
        uVar8 = 4;
      }
      *puVar7 = uVar8 | uVar2;
      lVar6 = (long)pTerm->iParent;
      if (lVar6 < 0) {
        return;
      }
      pWVar4 = pTerm->pWC->a;
      puVar1 = &pWVar4[lVar6].nChild;
      *puVar1 = *puVar1 + 0xff;
      if (*puVar1 != '\0') {
        return;
      }
      pTerm = pWVar4 + lVar6;
      puVar7 = &pTerm->wtFlags;
      uVar2 = pTerm->wtFlags;
    } while ((uVar2 & 4) == 0);
  }
  return;
}

Assistant:

static void disableTerm(WhereLevel *pLevel, WhereTerm *pTerm){
  int nLoop = 0;
  assert( pTerm!=0 );
  while( (pTerm->wtFlags & TERM_CODED)==0
      && (pLevel->iLeftJoin==0 || ExprHasProperty(pTerm->pExpr, EP_FromJoin))
      && (pLevel->notReady & pTerm->prereqAll)==0
  ){
    if( nLoop && (pTerm->wtFlags & TERM_LIKE)!=0 ){
      pTerm->wtFlags |= TERM_LIKECOND;
    }else{
      pTerm->wtFlags |= TERM_CODED;
    }
    if( pTerm->iParent<0 ) break;
    pTerm = &pTerm->pWC->a[pTerm->iParent];
    assert( pTerm!=0 );
    pTerm->nChild--;
    if( pTerm->nChild!=0 ) break;
    nLoop++;
  }
}